

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O1

void __thiscall
Js::JavascriptCopyOnAccessNativeIntArray::MarshalCrossSite_TTDInflate
          (JavascriptCopyOnAccessNativeIntArray *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (*(long *)&(this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.
                super_JavascriptArray.super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject !=
      VirtualTableInfo<Js::JavascriptCopyOnAccessNativeIntArray>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x48b,
                                "(VirtualTableInfo<JavascriptCopyOnAccessNativeIntArray>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.super_JavascriptArray.
  super_ArrayObject.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)
       VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptCopyOnAccessNativeIntArray>_>::Address;
  return;
}

Assistant:

JavascriptCopyOnAccessNativeIntArray(uint32 length, DynamicType * type) :
            JavascriptNativeIntArray(length, type) {}